

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O3

int mbedtls_ripemd160_self_test(int verbose)

{
  undefined4 uVar1;
  uchar *input;
  size_t ilen;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uchar output [20];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  lVar2 = 0;
  while( true ) {
    if (verbose != 0) {
      printf("  RIPEMD-160 test #%d: ",(ulong)((int)lVar2 + 1));
    }
    input = (uchar *)ripemd160_test_input[lVar2];
    ilen = strlen((char *)input);
    mbedtls_ripemd160(input,ilen,local_48);
    uVar1 = *(undefined4 *)(ripemd160_test_md[lVar2] + 0x10);
    auVar3[0] = -(ripemd160_test_md[lVar2][0] == local_48[0]);
    auVar3[1] = -(ripemd160_test_md[lVar2][1] == local_48[1]);
    auVar3[2] = -(ripemd160_test_md[lVar2][2] == local_48[2]);
    auVar3[3] = -(ripemd160_test_md[lVar2][3] == local_48[3]);
    auVar3[4] = -(ripemd160_test_md[lVar2][4] == local_48[4]);
    auVar3[5] = -(ripemd160_test_md[lVar2][5] == local_48[5]);
    auVar3[6] = -(ripemd160_test_md[lVar2][6] == local_48[6]);
    auVar3[7] = -(ripemd160_test_md[lVar2][7] == local_48[7]);
    auVar3[8] = -(ripemd160_test_md[lVar2][8] == local_48[8]);
    auVar3[9] = -(ripemd160_test_md[lVar2][9] == local_48[9]);
    auVar3[10] = -(ripemd160_test_md[lVar2][10] == local_48[10]);
    auVar3[0xb] = -(ripemd160_test_md[lVar2][0xb] == local_48[0xb]);
    auVar3[0xc] = -(ripemd160_test_md[lVar2][0xc] == local_48[0xc]);
    auVar3[0xd] = -(ripemd160_test_md[lVar2][0xd] == local_48[0xd]);
    auVar3[0xe] = -(ripemd160_test_md[lVar2][0xe] == local_48[0xe]);
    auVar3[0xf] = -(ripemd160_test_md[lVar2][0xf] == local_48[0xf]);
    auVar4[0] = -((char)uVar1 == (char)local_38);
    auVar4[1] = -((char)((uint)uVar1 >> 8) == (char)((uint)local_38 >> 8));
    auVar4[2] = -((char)((uint)uVar1 >> 0x10) == (char)((uint)local_38 >> 0x10));
    auVar4[3] = -((char)((uint)uVar1 >> 0x18) == (char)((uint)local_38 >> 0x18));
    auVar4[4] = 0xff;
    auVar4[5] = 0xff;
    auVar4[6] = 0xff;
    auVar4[7] = 0xff;
    auVar4[8] = 0xff;
    auVar4[9] = 0xff;
    auVar4[10] = 0xff;
    auVar4[0xb] = 0xff;
    auVar4[0xc] = 0xff;
    auVar4[0xd] = 0xff;
    auVar4[0xe] = 0xff;
    auVar4[0xf] = 0xff;
    auVar3 = auVar3 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff) break;
    if (verbose == 0) {
      lVar2 = lVar2 + 1;
      if (lVar2 == 8) {
        return 0;
      }
    }
    else {
      puts("passed");
      lVar2 = lVar2 + 1;
      if (lVar2 == 8) {
        putchar(10);
        return 0;
      }
    }
  }
  if (verbose != 0) {
    puts("failed");
    return 1;
  }
  return 1;
}

Assistant:

int mbedtls_ripemd160_self_test( int verbose )
{
    int i;
    unsigned char output[20];

    memset( output, 0, sizeof output );

    for( i = 0; i < TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  RIPEMD-160 test #%d: ", i + 1 );

        mbedtls_ripemd160( (const unsigned char *) ripemd160_test_input[i],
                   strlen( ripemd160_test_input[i] ),
                   output );

        if( memcmp( output, ripemd160_test_md[i], 20 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}